

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix::
TabulatedBackgroundRMatrix
          (TabulatedBackgroundRMatrix *this,int index,
          vector<long,_std::allocator<long>_> *boundaries,
          vector<long,_std::allocator<long>_> *interpolants,
          vector<double,_std::allocator<double>_> *energies,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *rmatrix)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *values;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::
  extractReal<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
            ((vector<double,_std::allocator<double>_> *)&local_60,
             (TabulatedBackgroundRMatrix *)rmatrix,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)boundaries);
  Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::
  extractImaginary<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (TabulatedBackgroundRMatrix *)rmatrix,values);
  TabulatedBackgroundRMatrix
            (this,index,boundaries,interpolants,energies,
             (vector<double,_std::allocator<double>_> *)&local_60,
             (vector<double,_std::allocator<double>_> *)&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  return;
}

Assistant:

TabulatedBackgroundRMatrix( int index,
                            std::vector< long >&& boundaries,
                            std::vector< long >&& interpolants,
                            std::vector< double >&& energies,
                            std::vector< std::complex< double > >&& rmatrix ) :
  TabulatedBackgroundRMatrix( index,
                              std::move( boundaries ),
                              std::move( interpolants ),
                              std::move( energies ),
                              extractReal( rmatrix ),
                              extractImaginary( rmatrix ) ) {}